

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O3

int __thiscall ON_String::ReverseFind(ON_String *this,char *s)

{
  uint uVar1;
  char *pcVar2;
  long lVar3;
  int iVar4;
  ON_Internal_Empty_aString *pOVar5;
  int iVar6;
  char *__s1;
  char *p0;
  size_t __n;
  
  if ((s != (char *)0x0) && (*s != '\0')) {
    pcVar2 = this->m_s;
    pOVar5 = &empty_astring;
    if (pcVar2 != (char *)0x0) {
      pOVar5 = (ON_Internal_Empty_aString *)(pcVar2 + -0xc);
    }
    uVar1 = (pOVar5->header).string_length;
    if (0 < (int)uVar1) {
      __n = 0xffffffffffffffff;
      do {
        lVar3 = __n + 1;
        __n = __n + 1;
      } while (s[lVar3] != '\0');
      if (((int)__n <= (int)uVar1) && (-1 < (int)(uVar1 - __n))) {
        __s1 = pcVar2 + (uVar1 - __n & 0xffffffff);
        iVar6 = uVar1 - (int)__n;
        do {
          iVar4 = strncmp(__s1,s,__n);
          if (iVar4 == 0) {
            return iVar6;
          }
          __s1 = __s1 + -1;
          iVar6 = iVar6 + -1;
        } while (pcVar2 <= __s1);
      }
    }
  }
  return -1;
}

Assistant:

int ON_String::ReverseFind(const char* s) const
{
  int rc = -1;
  if (s && s[0] && !IsEmpty()) 
  {
    int s_len = 0;
    while (0 != s[s_len])
      s_len++;
    if (Length() >= s_len)
    {
      const char* p0 = m_s;
      const char* p = p0 + (Length()-s_len);
      while (p >= p0)
      {
        if (0 == strncmp(p, s, s_len))
          return ((int)(p - p0));
        p--;
      }
    }
  }
  return rc;
}